

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O1

void __thiscall CCharacterCore::Reset(CCharacterCore *this)

{
  (this->m_HookDir).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  (this->m_HookDir).field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  this->m_HookTick = 0;
  this->m_HookState = 0;
  (this->m_HookDragVel).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  (this->m_HookDragVel).field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  (this->m_HookPos).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  (this->m_HookPos).field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  (this->m_Pos).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  (this->m_Pos).field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  (this->m_Vel).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  (this->m_Vel).field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  this->m_HookedPlayer = -1;
  this->m_Jumped = 0;
  this->m_TriggeredEvents = 0;
  this->m_Death = false;
  return;
}

Assistant:

void CCharacterCore::Reset()
{
	m_Pos = vec2(0,0);
	m_Vel = vec2(0,0);
	m_HookDragVel = vec2(0,0);
	m_HookPos = vec2(0,0);
	m_HookDir = vec2(0,0);
	m_HookTick = 0;
	m_HookState = HOOK_IDLE;
	m_HookedPlayer = -1;
	m_Jumped = 0;
	m_TriggeredEvents = 0;
	m_Death = false;
}